

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsLong
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  int16_t iVar1;
  uint uVar2;
  int32_t iVar3;
  int64_t value;
  uint64_t uVar4;
  uint64_t uVar5;
  long value_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_01;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_02;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_03;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_04;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_05;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_06;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar6;
  PriceField PVar7;
  FieldDef *field_def_local;
  ByteBuffer *buffer_local;
  
  switch(field_def->encoding_) {
  case FIXED1:
    uVar2 = (**(buffer->super_InputStream)._vptr_InputStream)();
    PriceField::PriceField((PriceField *)this,(ulong)(uVar2 & 0xff));
    aVar6 = extraout_RDX;
    break;
  case FIXED2:
    iVar1 = tools::ByteBuffer::ReadShort(buffer);
    PriceField::PriceField((PriceField *)this,(long)iVar1);
    aVar6 = extraout_RDX_00;
    break;
  case FIXED3:
    iVar3 = tools::ByteBuffer::ReadMedium(buffer);
    PriceField::PriceField((PriceField *)this,(long)iVar3);
    aVar6 = extraout_RDX_01;
    break;
  case FIXED4:
    iVar3 = tools::ByteBuffer::ReadInt(buffer);
    PriceField::PriceField((PriceField *)this,(long)iVar3);
    aVar6 = extraout_RDX_02;
    break;
  default:
    SkipFieldValue(buffer,field_def);
    PriceField::PriceField((PriceField *)this);
    aVar6 = extraout_RDX_06;
    break;
  case FIXED8:
    value = tools::ByteBuffer::ReadLong(buffer);
    PriceField::PriceField((PriceField *)this,value);
    aVar6 = extraout_RDX_03;
    break;
  case VARINT:
    uVar5 = tools::Varint::ReadU64(&buffer->super_InputStream);
    uVar4 = EncodingUtil::PowerOfTen(field_def->scale_);
    PriceField::PriceField((PriceField *)this,uVar5 * uVar4);
    aVar6 = extraout_RDX_04;
    break;
  case ZIGZAG:
    uVar5 = tools::Varint::ReadU64(&buffer->super_InputStream);
    value_00 = tools::Varint::ZigzagToLong(uVar5);
    PriceField::PriceField((PriceField *)this,value_00);
    aVar6 = extraout_RDX_05;
  }
  PVar7.field_1.long_value_ = aVar6.long_value_;
  PVar7._0_8_ = this;
  return PVar7;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsLong(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED1:
            return PriceField((int64_t) buffer.ReadByte());
        case FIXED2:
            return PriceField((int64_t) buffer.ReadShort());
        case FIXED3:
            return PriceField((int64_t) buffer.ReadMedium());
        case FIXED4:
            return PriceField((int64_t) buffer.ReadInt());
        case FIXED8:
            return PriceField(buffer.ReadLong());
        case VARINT:
            return PriceField((int64_t) (Varint::ReadU64(buffer) * EncodingUtil::PowerOfTen(field_def.scale_)));
        case ZIGZAG:
            return PriceField(static_cast<int64_t>(Varint::ZigzagToLong(tools::Varint::ReadU64(buffer))));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();

}